

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void accumulate(ProcessResult *r,ProcessResult *term)

{
  size_t sVar1;
  
  sVar1 = term->replaced_path;
  r->total = r->total + term->total;
  r->replaced_path = r->replaced_path + sVar1;
  sVar1 = term->user_to_system;
  r->system_to_user = term->system_to_user + r->system_to_user;
  r->user_to_system = sVar1 + r->user_to_system;
  sVar1 = term->failed;
  r->untouched = term->untouched + r->untouched;
  r->failed = sVar1 + r->failed;
  return;
}

Assistant:

void accumulate(ProcessResult *r, const ProcessResult &term) {
  r->total += term.total;
  r->replaced_path += term.replaced_path;
  r->system_to_user += term.system_to_user;
  r->user_to_system += term.user_to_system;
  r->untouched += term.untouched;
  r->failed += term.failed;
}